

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<Object_Copy_Count_Test>::
handle<Object_Copy_Count_Test,void>
          (Handle_Return<Object_Copy_Count_Test> *this,Object_Copy_Count_Test *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<Object_Copy_Count_Test> local_28;
  Object_Copy_Count_Test *local_18;
  Object_Copy_Count_Test *r_local;
  
  local_18 = r;
  r_local = (Object_Copy_Count_Test *)this;
  std::make_shared<Object_Copy_Count_Test,Object_Copy_Count_Test>
            ((Object_Copy_Count_Test *)&local_28);
  Boxed_Value::Boxed_Value<std::shared_ptr<Object_Copy_Count_Test>,void>
            ((Boxed_Value *)this,&local_28,true);
  Catch::clara::std::shared_ptr<Object_Copy_Count_Test>::~shared_ptr(&local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }